

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_EntityIdentifier.cpp
# Opt level: O3

KBOOL __thiscall
KDIS::DATA_TYPE::LE_EntityIdentifier::operator<
          (LE_EntityIdentifier *this,LE_EntityIdentifier *Value)

{
  uint uVar1;
  uint uVar2;
  
  uVar2._0_1_ = this->m_ui8SiteID;
  uVar2._1_1_ = this->m_ui8ApplicationID;
  uVar2._2_2_ = this->m_ui16EntityID;
  uVar1._0_1_ = Value->m_ui8SiteID;
  uVar1._1_1_ = Value->m_ui8ApplicationID;
  uVar1._2_2_ = Value->m_ui16EntityID;
  return uVar2 < uVar1;
}

Assistant:

KBOOL LE_EntityIdentifier::operator <  ( const LE_EntityIdentifier & Value ) const
{
    // We will bit shift all 3 fields into a single KUINT32, this will generate a new unique value which we can then use for comparison.
    // bits 0-7  = SiteID
    // bits 8-15 = ApplicationID
    // bits 16-31 = EntityID
    KUINT32 ui32ThisCmpVal = 0, ui32OtherCmpVal = 0;

    ui32ThisCmpVal = m_ui8SiteID | ( KUINT32 )m_ui8ApplicationID << 8 | ( KUINT32 )m_ui16EntityID << 16;
    ui32OtherCmpVal = Value.m_ui8SiteID | ( KUINT32 )Value.m_ui8ApplicationID << 8 | ( KUINT32 )Value.m_ui16EntityID << 16;

    return ui32ThisCmpVal < ui32OtherCmpVal;
}